

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

Roaring * doublechecked::Roaring::fastunion
                    (Roaring *__return_storage_ptr__,size_t n,Roaring **inputs)

{
  bool bVar1;
  Roaring **inputs_00;
  uint64_t uVar2;
  size_t sVar3;
  Roaring temp;
  Roaring local_80;
  
  inputs_00 = (Roaring **)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  if (n != 0) {
    memcpy(inputs_00,inputs,n * 8);
  }
  roaring::Roaring::fastunion(&local_80.plain,n,inputs_00);
  Roaring(__return_storage_ptr__,&local_80.plain);
  roaring::Roaring::~Roaring(&local_80.plain);
  operator_delete__(inputs_00);
  if (n == 0) {
    uVar2 = cardinality(__return_storage_ptr__);
    _assert_true((ulong)(uVar2 == 0),"ans.cardinality() == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
                 ,0x297);
  }
  else {
    Roaring(&local_80,*inputs);
    if (n != 1) {
      sVar3 = 1;
      do {
        operator|=(&local_80,inputs[sVar3]);
        sVar3 = sVar3 + 1;
      } while (n != sVar3);
    }
    bVar1 = operator==(&local_80,__return_storage_ptr__);
    _assert_true((ulong)bVar1,"temp == ans",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
                 ,0x29b);
    ~Roaring(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

static Roaring fastunion(size_t n, const Roaring **inputs) {
        auto plain_inputs = new const roaring::Roaring *[n];
        for (size_t i = 0; i < n; ++i) plain_inputs[i] = &inputs[i]->plain;
        Roaring ans(roaring::Roaring::fastunion(n, plain_inputs));
        delete[] plain_inputs;

        if (n == 0)
            assert_true(ans.cardinality() == 0);
        else {
            Roaring temp = *inputs[0];
            for (size_t i = 1; i < n; ++i) temp |= *inputs[i];
            assert_true(temp == ans);
        }

        return ans;
    }